

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDisc_dns.c
# Opt level: O2

int main(void)

{
  int iVar1;
  long *plVar2;
  void *pvVar3;
  void *flagvalue;
  void *flagvalue_00;
  int retval;
  sunrealtype t;
  int flag;
  sunrealtype local_68;
  long nst1;
  SUNContext sunctx;
  long nst2;
  long nst;
  void *cvode_mem;
  void *local_38;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 != 0) {
    return 1;
  }
  plVar2 = (long *)N_VNew_Serial(1,sunctx);
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  pvVar3 = (void *)CVodeCreate(2,sunctx);
  cvode_mem = pvVar3;
  iVar1 = check_retval(pvVar3,"CVodeCreate",0);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeInit(0,pvVar3,f,plVar2);
  iVar1 = check_retval(&retval,"CVodeInit",1);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeSStolerances(0x3f50624dd2f1a9fc,0x3f1a36e2eb1c432d,pvVar3);
  iVar1 = check_retval(&retval,"CVodeSStolerances",1);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeSetUserData(pvVar3,&flag);
  iVar1 = check_retval(&retval,"CVodeSetUserData",1);
  if (iVar1 != 0) {
    return 1;
  }
  flagvalue = (void *)SUNDenseMatrix(1,1,sunctx);
  iVar1 = check_retval(flagvalue,"SUNDenseMatrix",0);
  if (iVar1 != 0) {
    return 1;
  }
  flagvalue_00 = (void *)SUNLinSol_Dense(plVar2,flagvalue,sunctx);
  iVar1 = check_retval(flagvalue_00,"SUNLinSol_Dense",0);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeSetLinearSolver(pvVar3,flagvalue_00,flagvalue);
  iVar1 = check_retval(&retval,"CVodeSetLinearSolver",1);
  if (iVar1 != 0) {
    return 1;
  }
  puts("\nDiscontinuity in solution\n");
  retval = CVodeSetStopTime(0x3ff0000000000000,pvVar3);
  iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
  if (iVar1 != 0) {
    return 1;
  }
  t = 0.0;
  flag = 1;
  local_38 = flagvalue_00;
  while (printf("%12.8e  %12.8e\n",t,**(undefined8 **)(*plVar2 + 0x10)), t < 1.0) {
    retval = CVode(pvVar3,plVar2,&t,2);
    iVar1 = check_retval(&retval,"CVode",1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  retval = CVodeGetNumSteps(pvVar3,&nst1);
  iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
  if (iVar1 != 0) {
    return 1;
  }
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  retval = CVodeReInit(0x3ff0000000000000,pvVar3,plVar2);
  iVar1 = check_retval(&retval,"CVodeReInit",1);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeSetStopTime(0x4000000000000000,pvVar3);
  iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
  if (iVar1 != 0) {
    return 1;
  }
  flag = 1;
  t = 1.0;
  while (printf("%12.8e  %12.8e\n",t,**(undefined8 **)(*plVar2 + 0x10)), t < 2.0) {
    retval = CVode(pvVar3,plVar2,&t,2);
    iVar1 = check_retval(&retval,"CVode",1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  retval = CVodeGetNumSteps(pvVar3,&nst2);
  iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
  if (iVar1 != 0) {
    return 1;
  }
  nst = nst2 + nst1;
  printf("\nNumber of steps: %ld + %ld = %ld\n");
  puts("\nDiscontinuity in RHS: Case 1 - explicit treatment\n");
  pvVar3 = cvode_mem;
  **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
  retval = CVodeReInit(0,cvode_mem,plVar2);
  iVar1 = check_retval(&retval,"CVodeReInit",1);
  if (iVar1 != 0) {
    return 1;
  }
  retval = CVodeSetStopTime(0x3ff0000000000000,pvVar3);
  iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
  if (iVar1 != 0) {
    return 1;
  }
  t = 0.0;
  flag = 1;
  while (printf("%12.8e  %12.8e\n",t,**(undefined8 **)(*plVar2 + 0x10)), t < 1.0) {
    retval = CVode(0x3ff0000000000000,pvVar3,plVar2,&t,2);
    iVar1 = check_retval(&retval,"CVode",1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  retval = CVodeGetNumSteps(pvVar3,&nst1);
  iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
  if (iVar1 != 0) {
    return 1;
  }
  local_68 = 1.0;
  retval = CVodeReInit(pvVar3,plVar2);
  retval = CVodeSetStopTime(0x4000000000000000,pvVar3);
  iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
  if (iVar1 != 0) {
    return 1;
  }
  flag = 2;
  t = 1.0;
  while (printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10)), t < 2.0) {
    retval = CVode(0x4000000000000000,pvVar3,plVar2,&t,2);
    iVar1 = check_retval(&retval,"CVode",1);
    if (iVar1 != 0) {
      return 1;
    }
    local_68 = t;
  }
  retval = CVodeGetNumSteps(pvVar3,&nst2);
  iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
  if (iVar1 == 0) {
    nst = nst2 + nst1;
    printf("\nNumber of steps: %ld + %ld = %ld\n");
    puts("\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n");
    pvVar3 = cvode_mem;
    **(undefined8 **)(*plVar2 + 0x10) = 0x3ff0000000000000;
    retval = CVodeReInit(0,cvode_mem,plVar2);
    iVar1 = check_retval(&retval,"CVodeReInit",1);
    if (iVar1 == 0) {
      local_68 = 1.0;
      retval = CVodeSetStopTime(pvVar3);
      iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
      if (iVar1 == 0) {
        t = 0.0;
        flag = 1;
        do {
          printf("%12.8e  %12.8e\n",t,**(undefined8 **)(*plVar2 + 0x10));
          if (1.0 <= t) {
            retval = CVodeGetNumSteps(pvVar3,&nst1);
            iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
            if (iVar1 != 0) {
              return 1;
            }
            retval = CVodeSetStopTime(0x4000000000000000,pvVar3);
            iVar1 = check_retval(&retval,"CVodeSetStopTime",1);
            if (iVar1 != 0) {
              return 1;
            }
            flag = 2;
            t = 1.0;
            while( true ) {
              printf("%12.8e  %12.8e\n",local_68,**(undefined8 **)(*plVar2 + 0x10));
              if (2.0 <= t) {
                retval = CVodeGetNumSteps(pvVar3,&nst);
                iVar1 = check_retval(&retval,"CvodeGetNumSteps",1);
                pvVar3 = local_38;
                if (iVar1 != 0) {
                  return 1;
                }
                nst2 = nst - nst1;
                printf("\nNumber of steps: %ld + %ld = %ld\n");
                N_VDestroy(plVar2);
                SUNMatDestroy(flagvalue);
                SUNLinSolFree(pvVar3);
                CVodeFree(&cvode_mem);
                SUNContext_Free(&sunctx);
                return 0;
              }
              retval = CVode(0x4000000000000000,pvVar3,plVar2,&t,2);
              iVar1 = check_retval(&retval,"CVode",1);
              if (iVar1 != 0) break;
              local_68 = t;
            }
            return 1;
          }
          retval = CVode(0x3ff0000000000000,pvVar3,plVar2,&t,2);
          iVar1 = check_retval(&retval,"CVode",1);
        } while (iVar1 == 0);
      }
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  void* cvode_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext sunctx;

  N_Vector y;
  int flag, retval;
  sunrealtype reltol, abstol, t0, t1, t2, t;
  long int nst1, nst2, nst;

  reltol = SUN_RCONST(1.0e-3);
  abstol = SUN_RCONST(1.0e-4);

  t0 = SUN_RCONST(0.0);
  t1 = SUN_RCONST(1.0);
  t2 = SUN_RCONST(2.0);

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate the vector of initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /*
   * ------------------------------------------------------------
   *  Shared initialization and setup
   * ------------------------------------------------------------
   */

  /* Call CVodeCreate to create CVODE memory block and specify the
   * Backward Differentiaion Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize integrator memory and specify the
   * user's right hand side function y'=f(t,y), the initial time T0
   * and the initial condiition vector y. */
  retval = CVodeInit(cvode_mem, f, t0, y);
  if (check_retval((void*)&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify integration tolereances,
   * specifically the scalar relative and absolute tolerance. */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval((void*)&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Provide RHS flag as user data which can be access in user provided routines */
  retval = CVodeSetUserData(cvode_mem, &flag);
  if (check_retval((void*)&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solver */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense linear solver for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the linear solver and matrix to CVode by calling CVodeSetLinearSolver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval((void*)&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /*
   * ---------------------------------------------------------------
   * Discontinuity in the solution
   *
   * 1) Integrate to the discontinuity
   * 2) Integrate from the discontinuity
   * ---------------------------------------------------------------
   */

  /* ---- Integrate to the discontinuity */

  printf("\nDiscontinuity in solution\n\n");

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }
  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* Include discontinuity */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver */
  retval = CVodeReInit(cvode_mem, t1, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 1 - explicit treatment
   * Note that it is not required to set TSTOP, but without it
   * we would have to find y(t1) to reinitialize the solver.
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 1 - explicit treatment\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* If TSTOP was not set, we'd need to find y(t1): */
  /* CVodeGetDky(cvode_mem, t1, 0, y); */

  /* ---- Integrate from the discontinuity */

  /* Reinitialize solver */
  retval = CVodeReInit(cvode_mem, t1, y);

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst2);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst = nst1 + nst2;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /*
   * ---------------------------------------------------------------
   * Discontinuity in RHS: Case 2 - let CVODE deal with it
   * Note that here we MUST set TSTOP to ensure that the
   * change in the RHS happens at the appropriate time
   * ---------------------------------------------------------------
   */

  printf("\nDiscontinuity in RHS: Case 2 - let CVODE deal with it\n\n");

  /* Set initial condition */
  NV_Ith_S(y, 0) = SUN_RCONST(1.0);

  /* Reinitialize the solver. CVodeReInit does not reallocate memory
   * so it can only be used when the new problem size is the same as
   * the problem size when CVodeCreate was called. */
  retval = CVodeReInit(cvode_mem, t0, y);
  if (check_retval((void*)&retval, "CVodeReInit", 1)) { return (1); }

  /* ---- Integrate to the discontinuity */

  /* Set TSTOP (max time solution proceeds to) to location of discont. */
  retval = CVodeSetStopTime(cvode_mem, t1);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS1; /* use -y for RHS */
  t    = t0;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  while (t < t1)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t1, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took to get to the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst1);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* ---- Integrate from the discontinuity */

  /* set TSTOP (max time solution proceeds to) - this is not required */
  retval = CVodeSetStopTime(cvode_mem, t2);
  if (check_retval((void*)&retval, "CVodeSetStopTime", 1)) { return (1); }

  flag = RHS2; /* use -5y for RHS */
  t    = t1;   /* set the integrator start time */

  printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));

  while (t < t2)
  {
    /* advance solver just one internal step */
    retval = CVode(cvode_mem, t2, y, &t, CV_ONE_STEP);
    if (check_retval((void*)&retval, "CVode", 1)) { return (1); }
    printf("%12.8" ESYM "  %12.8" ESYM "\n", t, NV_Ith_S(y, 0));
  }

  /* Get the number of steps the solver took after the discont. */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval((void*)&retval, "CvodeGetNumSteps", 1)) { return (1); }

  /* Print statistics */
  nst2 = nst - nst1;
  printf("\nNumber of steps: %ld + %ld = %ld\n", nst1, nst2, nst);

  /* Free memory */
  N_VDestroy(y);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}